

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManComputeMapping(Nf_Man_t *p)

{
  word *pwVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  ulong uVar4;
  Nf_Obj_t *pNVar5;
  long lVar6;
  uint uVar7;
  Gia_Man_t *pGVar8;
  word wVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  
  pGVar8 = p->pGia;
  uVar10 = (ulong)(uint)pGVar8->nObjs;
  if (0 < pGVar8->nObjs) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar4 = *(ulong *)(&pGVar8->pObjs->field_0x0 + lVar14);
      uVar7 = (uint)uVar4;
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        if ((((int)uVar7 < 0) || (uVar11 = uVar7 & 0x1fffffff, uVar11 == 0x1fffffff)) ||
           (uVar12 = (uint)(uVar4 >> 0x20) & 0x1fffffff, uVar11 != uVar12)) {
          Nf_ManCutMatch(p,(int)lVar13);
        }
        else {
          if ((int)uVar10 <= lVar13) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if ((((int)uVar7 < 0) || (uVar11 == 0x1fffffff)) || (uVar11 != uVar12)) {
            __assert_fail("Gia_ObjIsBuf(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x4bf,"void Nf_ObjPrepareBuf(Nf_Man_t *, Gia_Obj_t *)");
          }
          pNVar5 = p->pNfObjs;
          pwVar1 = &pNVar5->M[1][1].D + lVar14;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          pwVar1 = &pNVar5->M[1][0].A + lVar14;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          puVar2 = (undefined8 *)(&pNVar5->M[1][0].field_0x0 + lVar14 * 8);
          *puVar2 = 0;
          puVar2[1] = 0;
          pwVar1 = &pNVar5->M[0][1].D + lVar14;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          pwVar1 = &pNVar5->M[0][0].A + lVar14;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          puVar2 = (undefined8 *)(&pNVar5->M[0][0].field_0x0 + lVar14 * 8);
          *puVar2 = 0;
          puVar2[1] = 0;
          lVar6 = (ulong)((uint)(uVar4 >> 0x19) & 0x10) * 3;
          uVar10 = (ulong)(uVar7 & 0x1fffffff);
          wVar9 = *(word *)((long)&pNVar5[-uVar10].M[0][0].D + lVar14 * 8 + lVar6);
          (&pNVar5->M[0][1].D)[lVar14] = wVar9;
          (&pNVar5->M[0][0].D)[lVar14] = wVar9;
          wVar9 = *(word *)((long)&pNVar5[-uVar10].M[0][0].A + lVar14 * 8 + lVar6);
          (&pNVar5->M[0][1].A)[lVar14] = wVar9;
          (&pNVar5->M[0][0].A)[lVar14] = wVar9;
          pbVar3 = &pNVar5->M[0][0].field_0x3 + lVar14 * 8;
          *pbVar3 = *pbVar3 | 0x80;
          wVar9 = p->InvDelay + *(long *)((long)&pNVar5[-uVar10].M[0][0].D + lVar14 * 8 + lVar6);
          (&pNVar5->M[1][1].D)[lVar14] = wVar9;
          (&pNVar5->M[1][0].D)[lVar14] = wVar9;
          wVar9 = p->InvArea + *(long *)((long)&pNVar5[-uVar10].M[0][0].A + lVar14 * 8 + lVar6);
          (&pNVar5->M[1][1].A)[lVar14] = wVar9;
          (&pNVar5->M[1][0].A)[lVar14] = wVar9;
          pbVar3 = &pNVar5->M[1][1].field_0x3 + lVar14 * 8;
          *pbVar3 = *pbVar3 | 0x40;
          pbVar3 = &pNVar5->M[1][0].field_0x3 + lVar14 * 8;
          *pbVar3 = *pbVar3 | 0xc0;
        }
      }
      lVar13 = lVar13 + 1;
      pGVar8 = p->pGia;
      uVar10 = (ulong)pGVar8->nObjs;
      lVar14 = lVar14 + 0xc;
    } while (lVar13 < (long)uVar10);
  }
  return;
}

Assistant:

void Nf_ManComputeMapping( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Nf_ObjPrepareBuf( p, pObj );
        else
            Nf_ManCutMatch( p, i );
}